

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,event_declaration_t *d)

{
  system_t *psVar1;
  string *name;
  attributes_t *attributes;
  attributes_t local_50;
  event_declaration_t *local_18;
  event_declaration_t *d_local;
  system_builder_t *this_local;
  
  psVar1 = this->_system;
  local_18 = d;
  d_local = (event_declaration_t *)this;
  name = parsing::event_declaration_t::name_abi_cxx11_(d);
  attributes = parsing::declaration_t::attributes((declaration_t *)local_18);
  attributes_t::attributes_t(&local_50,attributes);
  events_t::add_event(&psVar1->super_events_t,name,&local_50);
  attributes_t::~attributes_t(&local_50);
  return;
}

Assistant:

virtual void visit(tchecker::parsing::event_declaration_t const & d) { _system.add_event(d.name(), d.attributes()); }